

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TMS320C64xDisassembler.c
# Opt level: O0

DecodeStatus DecodeScst5(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  uint in_ESI;
  MCInst *in_RDI;
  int32_t imm;
  undefined4 local_24;
  
  local_24 = in_ESI;
  if ((in_ESI & 0x10) != 0) {
    local_24 = in_ESI | 0xffffffe0;
  }
  MCOperand_CreateImm0(in_RDI,(long)(int)local_24);
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodeScst5(MCInst *Inst, unsigned Val,
		uint64_t Address, void *Decoder)
{
	int32_t imm;

	imm = Val;
	/* Sign extend 5 bit value */
	if(imm & (1 << (5 - 1)))
		imm |= ~((1 << 5) - 1);

	MCOperand_CreateImm0(Inst, imm);

	return MCDisassembler_Success;
}